

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::ExtractVariables(cmCTestScriptHandler *this)

{
  string *dir;
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  double dVar6;
  char updateVar [40];
  string msg;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string *local_50;
  char *local_48;
  char *local_40;
  char *updateVal;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_SOURCE_DIRECTORY",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  dir = &this->SourceDir;
  std::__cxx11::string::_M_assign((string *)dir);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_BINARY_DIRECTORY",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->BinaryDir);
  std::__cxx11::string::~string((string *)updateVar);
  cmsys::SystemTools::AddKeepPath(dir);
  cmsys::SystemTools::AddKeepPath(&this->BinaryDir);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_COMMAND",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CTestCmd);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_CVS_CHECKOUT",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CVSCheckOut);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_DASHBOARD_ROOT",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CTestRoot);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_UPDATE_COMMAND",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
  std::__cxx11::string::~string((string *)updateVar);
  if ((this->UpdateCmd)._M_string_length == 0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)updateVar,"CTEST_CVS_COMMAND",(allocator<char> *)&msg);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
    std::__cxx11::string::_M_assign((string *)&this->UpdateCmd);
    std::__cxx11::string::~string((string *)updateVar);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_ENVIRONMENT",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CTestEnv);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_INITIAL_CACHE",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->InitialCache);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_CMAKE_COMMAND",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CMakeCmd);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_CMAKE_OUTPUT_FILE_NAME",(allocator<char> *)&msg);
  cmMakefile::GetSafeDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::_M_assign((string *)&this->CMOutFile);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_BACKUP_AND_RESTORE",(allocator<char> *)&msg);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)updateVar);
  this->Backup = bVar2;
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY",(allocator<char> *)&msg);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)updateVar);
  this->EmptyBinDir = bVar2;
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE",
             (allocator<char> *)&msg);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)updateVar);
  this->EmptyBinDirOnce = bVar2;
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_CONTINUOUS_MINIMUM_INTERVAL",(allocator<char> *)&msg);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::~string((string *)updateVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)updateVar,"CTEST_CONTINUOUS_DURATION",(allocator<char> *)&msg);
  local_58 = (string *)&this->CTestRoot;
  local_50 = dir;
  local_40 = pcVar4;
  local_48 = cmMakefile::GetDefinition(pcVar1,(string *)updateVar);
  std::__cxx11::string::~string((string *)updateVar);
  uVar5 = 1;
  do {
    if (uVar5 == 10) {
      if ((this->Backup == true) && ((this->CVSCheckOut)._M_string_length == 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"Backup was requested without specifying CTEST_CVS_CHECKOUT.",
                   (allocator<char> *)&local_78);
        cmSystemTools::Error(&msg);
        std::__cxx11::string::~string((string *)&msg);
        iVar3 = 3;
      }
      else if (((this->SourceDir)._M_string_length == 0) ||
              (((this->BinaryDir)._M_string_length == 0 || ((this->CTestCmd)._M_string_length == 0))
              )) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"CTEST_SOURCE_DIRECTORY = ",(allocator<char> *)&local_78);
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::append((char *)&msg);
        std::operator+(&local_78,"Some required settings in the configuration file were missing:\n",
                       &msg);
        cmSystemTools::Error(&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&msg);
        iVar3 = 4;
      }
      else {
        if ((this->CTestRoot)._M_string_length == 0) {
          cmsys::SystemTools::GetFilenamePath(&msg,local_50);
          std::__cxx11::string::operator=(local_58,(string *)&msg);
          std::__cxx11::string::~string((string *)&msg);
        }
        if (local_40 != (char *)0x0) {
          dVar6 = atof(local_40);
          this->MinimumInterval = dVar6 * 60.0;
        }
        if (local_48 != (char *)0x0) {
          dVar6 = atof(local_48);
          this->ContinuousDuration = dVar6 * 60.0;
        }
        UpdateElapsedTime(this);
        iVar3 = 0;
      }
      return iVar3;
    }
    sprintf(updateVar,"CTEST_EXTRA_UPDATES_%i",(ulong)uVar5);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,updateVar,(allocator<char> *)&local_78);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&msg);
    std::__cxx11::string::~string((string *)&msg);
    updateVal = pcVar4;
    if (pcVar4 != (char *)0x0) {
      if ((this->UpdateCmd)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,updateVar,&local_79);
        std::operator+(&msg,&local_78," specified without specifying CTEST_CVS_COMMAND.");
        cmSystemTools::Error(&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&local_78);
        return 0xc;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->ExtraUpdates,&updateVal);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int cmCTestScriptHandler::ExtractVariables()
{
  // Temporary variables
  const char* minInterval;
  const char* contDuration;

  this->SourceDir =
    this->Makefile->GetSafeDefinition("CTEST_SOURCE_DIRECTORY");
  this->BinaryDir =
    this->Makefile->GetSafeDefinition("CTEST_BINARY_DIRECTORY");

  // add in translations for src and bin
  cmSystemTools::AddKeepPath(this->SourceDir);
  cmSystemTools::AddKeepPath(this->BinaryDir);

  this->CTestCmd = this->Makefile->GetSafeDefinition("CTEST_COMMAND");
  this->CVSCheckOut = this->Makefile->GetSafeDefinition("CTEST_CVS_CHECKOUT");
  this->CTestRoot = this->Makefile->GetSafeDefinition("CTEST_DASHBOARD_ROOT");
  this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_UPDATE_COMMAND");
  if (this->UpdateCmd.empty()) {
    this->UpdateCmd = this->Makefile->GetSafeDefinition("CTEST_CVS_COMMAND");
  }
  this->CTestEnv = this->Makefile->GetSafeDefinition("CTEST_ENVIRONMENT");
  this->InitialCache =
    this->Makefile->GetSafeDefinition("CTEST_INITIAL_CACHE");
  this->CMakeCmd = this->Makefile->GetSafeDefinition("CTEST_CMAKE_COMMAND");
  this->CMOutFile =
    this->Makefile->GetSafeDefinition("CTEST_CMAKE_OUTPUT_FILE_NAME");

  this->Backup = this->Makefile->IsOn("CTEST_BACKUP_AND_RESTORE");
  this->EmptyBinDir =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY");
  this->EmptyBinDirOnce =
    this->Makefile->IsOn("CTEST_START_WITH_EMPTY_BINARY_DIRECTORY_ONCE");

  minInterval =
    this->Makefile->GetDefinition("CTEST_CONTINUOUS_MINIMUM_INTERVAL");
  contDuration = this->Makefile->GetDefinition("CTEST_CONTINUOUS_DURATION");

  char updateVar[40];
  int i;
  for (i = 1; i < 10; ++i) {
    sprintf(updateVar, "CTEST_EXTRA_UPDATES_%i", i);
    const char* updateVal = this->Makefile->GetDefinition(updateVar);
    if (updateVal) {
      if (this->UpdateCmd.empty()) {
        cmSystemTools::Error(
          std::string(updateVar) +
          " specified without specifying CTEST_CVS_COMMAND.");
        return 12;
      }
      this->ExtraUpdates.emplace_back(updateVal);
    }
  }

  // in order to backup and restore we also must have the cvs root
  if (this->Backup && this->CVSCheckOut.empty()) {
    cmSystemTools::Error(
      "Backup was requested without specifying CTEST_CVS_CHECKOUT.");
    return 3;
  }

  // make sure the required info is here
  if (this->SourceDir.empty() || this->BinaryDir.empty() ||
      this->CTestCmd.empty()) {
    std::string msg = "CTEST_SOURCE_DIRECTORY = ";
    msg += (!this->SourceDir.empty()) ? this->SourceDir.c_str() : "(Null)";
    msg += "\nCTEST_BINARY_DIRECTORY = ";
    msg += (!this->BinaryDir.empty()) ? this->BinaryDir.c_str() : "(Null)";
    msg += "\nCTEST_COMMAND = ";
    msg += (!this->CTestCmd.empty()) ? this->CTestCmd.c_str() : "(Null)";
    cmSystemTools::Error(
      "Some required settings in the configuration file were missing:\n" +
      msg);
    return 4;
  }

  // if the dashboard root isn't specified then we can compute it from the
  // this->SourceDir
  if (this->CTestRoot.empty()) {
    this->CTestRoot = cmSystemTools::GetFilenamePath(this->SourceDir);
  }

  // the script may override the minimum continuous interval
  if (minInterval) {
    this->MinimumInterval = 60 * atof(minInterval);
  }
  if (contDuration) {
    this->ContinuousDuration = 60.0 * atof(contDuration);
  }

  this->UpdateElapsedTime();

  return 0;
}